

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaModelGroupDefPtr
xmlSchemaParseModelGroupDefinition(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  xmlChar *refTargetNs;
  _xmlAttr *p_Var1;
  int iVar2;
  xmlAttrPtr pxVar3;
  xmlSchemaTypePtr attr;
  undefined4 extraout_var;
  xmlSchemaModelGroupDefPtr extraout_RAX;
  undefined8 *item;
  xmlSchemaRedefPtr_conflict pxVar4;
  undefined4 extraout_var_00;
  xmlSchemaModelGroupDefPtr pxVar5;
  undefined4 extraout_var_01;
  xmlSchemaModelGroupDefPtr extraout_RAX_00;
  xmlSchemaModelGroupDefPtr extraout_RAX_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  xmlAttrPtr extraout_RAX_02;
  xmlSchemaTypeType type;
  xmlNodePtr in_RCX;
  xmlSchemaTypePtr type_00;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlChar **in_R8;
  char *in_R9;
  xmlNodePtr node_00;
  xmlChar *name;
  char *in_stack_ffffffffffffffb8;
  xmlSchemaTypePtr local_38;
  
  pxVar3 = xmlSchemaGetPropNode(node,"name");
  if (pxVar3 == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1cc054,in_RCX,(char *)in_R8,in_R9
              );
    return extraout_RAX;
  }
  attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
  type_00 = (xmlSchemaTypePtr)&local_38;
  iVar2 = xmlSchemaPValAttrNode(ctxt,(xmlSchemaBasicItemPtr)pxVar3,(xmlAttrPtr)attr,type_00,in_R8);
  pxVar5 = (xmlSchemaModelGroupDefPtr)CONCAT44(extraout_var,iVar2);
  if (iVar2 != 0) {
    return pxVar5;
  }
  if (local_38 == (xmlSchemaTypePtr)0x0) {
LAB_00197a5e:
    item = (undefined8 *)0x0;
  }
  else {
    refTargetNs = ctxt->targetNamespace;
    item = (undefined8 *)(*xmlMalloc)(0x40);
    if (item == (undefined8 *)0x0) {
      xmlSchemaPErrMemory(ctxt);
      pxVar5 = extraout_RAX_01;
      goto LAB_00197a5e;
    }
    item[4] = 0;
    item[5] = 0;
    *item = 0;
    item[1] = 0;
    item[6] = 0;
    item[7] = 0;
    item[2] = 0;
    item[3] = 0;
    item[4] = local_38;
    *(undefined4 *)item = 0x11;
    item[6] = node;
    item[5] = refTargetNs;
    if (ctxt->isRedefine != 0) {
      pxVar4 = xmlSchemaAddRedef(ctxt,ctxt->redefined,item,(xmlChar *)local_38,refTargetNs);
      ctxt->redef = pxVar4;
      if (pxVar4 == (xmlSchemaRedefPtr_conflict)0x0) {
        pxVar5 = (xmlSchemaModelGroupDefPtr)(*xmlFree)(item);
        type_00 = local_38;
        goto LAB_00197a5e;
      }
      ctxt->redefCounter = 0;
      type_00 = local_38;
    }
    iVar2 = xmlSchemaAddItemSize(&ctxt->constructor->bucket->globals,5,item);
    pxVar5 = (xmlSchemaModelGroupDefPtr)CONCAT44(extraout_var_00,iVar2);
    if (iVar2 < 0) {
      xmlSchemaPErrMemory(ctxt);
      pxVar5 = (xmlSchemaModelGroupDefPtr)(*xmlFree)(item);
      item = (undefined8 *)0x0;
    }
    if (item != (undefined8 *)0x0) {
      iVar2 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
      pxVar5 = (xmlSchemaModelGroupDefPtr)CONCAT44(extraout_var_01,iVar2);
      if (iVar2 < 0) {
        xmlSchemaPErrMemory(ctxt);
        pxVar5 = extraout_RAX_00;
      }
    }
  }
  if (item == (undefined8 *)0x0) {
    return pxVar5;
  }
  for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
    if (p_Var1->ns == (xmlNs *)0x0) {
      iVar2 = xmlStrEqual(p_Var1->name,"name");
      if ((iVar2 == 0) &&
         (iVar2 = xmlStrEqual(p_Var1->name,"id"), ownerComp = extraout_RDX_00, iVar2 == 0))
      goto LAB_00197a9f;
    }
    else {
      iVar2 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      ownerComp = extraout_RDX;
      if (iVar2 != 0) {
LAB_00197a9f:
        xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,ownerComp,(xmlAttrPtr)type_00);
      }
    }
  }
  pxVar3 = xmlSchemaGetPropNode(node,"id");
  if (pxVar3 != (xmlAttrPtr)0x0) {
    iVar2 = xmlSchemaPValAttrNodeID(ctxt,pxVar3);
    pxVar3 = (xmlAttrPtr)CONCAT44(extraout_var_02,iVar2);
  }
  node_00 = node->children;
  if (node_00 == (xmlNodePtr)0x0) {
    node_00 = (xmlNodePtr)0x0;
  }
  else if (node_00->ns != (xmlNs *)0x0) {
    iVar2 = xmlStrEqual(node_00->name,(xmlChar *)"annotation");
    pxVar3 = (xmlAttrPtr)CONCAT44(extraout_var_03,iVar2);
    if (iVar2 != 0) {
      iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      pxVar3 = (xmlAttrPtr)CONCAT44(extraout_var_04,iVar2);
      if (iVar2 != 0) {
        pxVar3 = (xmlAttrPtr)xmlSchemaParseAnnotation(ctxt,node_00,1);
        item[1] = pxVar3;
        node_00 = node_00->next;
      }
    }
  }
  if (node_00 == (xmlNodePtr)0x0) {
    node_00 = (xmlNodePtr)0x0;
    goto LAB_00197c27;
  }
  if (node_00->ns == (xmlNs *)0x0) {
LAB_00197b98:
    if (node_00->ns != (xmlNs *)0x0) {
      iVar2 = xmlStrEqual(node_00->name,(xmlChar *)"choice");
      pxVar3 = (xmlAttrPtr)CONCAT44(extraout_var_07,iVar2);
      if (iVar2 != 0) {
        iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar3 = (xmlAttrPtr)CONCAT44(extraout_var_08,iVar2);
        type = XML_SCHEMA_TYPE_CHOICE;
        if (iVar2 != 0) goto LAB_00197c08;
      }
    }
    if (node_00->ns == (xmlNs *)0x0) goto LAB_00197c27;
    iVar2 = xmlStrEqual(node_00->name,(xmlChar *)"sequence");
    pxVar3 = (xmlAttrPtr)CONCAT44(extraout_var_09,iVar2);
    if (iVar2 == 0) goto LAB_00197c27;
    iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    pxVar3 = (xmlAttrPtr)CONCAT44(extraout_var_10,iVar2);
    type = XML_SCHEMA_TYPE_SEQUENCE;
    if (iVar2 == 0) goto LAB_00197c27;
  }
  else {
    iVar2 = xmlStrEqual(node_00->name,"all");
    pxVar3 = (xmlAttrPtr)CONCAT44(extraout_var_05,iVar2);
    if (iVar2 == 0) goto LAB_00197b98;
    iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    pxVar3 = (xmlAttrPtr)CONCAT44(extraout_var_06,iVar2);
    type = XML_SCHEMA_TYPE_ALL;
    if (iVar2 == 0) goto LAB_00197b98;
  }
LAB_00197c08:
  pxVar3 = (xmlAttrPtr)xmlSchemaParseModelGroup(ctxt,schema,node_00,type,0);
  item[3] = pxVar3;
  node_00 = node_00->next;
LAB_00197c27:
  if (node_00 != (xmlNodePtr)0x0) {
    xmlSchemaPContentErr
              (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,node_00,
               (xmlNodePtr)0x0,"(annotation?, (all | choice | sequence)?)",in_stack_ffffffffffffffb8
              );
    pxVar3 = extraout_RAX_02;
  }
  return (xmlSchemaModelGroupDefPtr)pxVar3;
}

Assistant:

static xmlSchemaModelGroupDefPtr
xmlSchemaParseModelGroupDefinition(xmlSchemaParserCtxtPtr ctxt,
				   xmlSchemaPtr schema,
				   xmlNodePtr node)
{
    xmlSchemaModelGroupDefPtr item;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    const xmlChar *name;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "name");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node,
	    "name", NULL);
	return (NULL);
    } else if (xmlSchemaPValAttrNode(ctxt, NULL, attr,
	xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	return (NULL);
    }
    item = xmlSchemaAddModelGroupDefinition(ctxt, schema, name,
	ctxt->targetNamespace, node);
    if (item == NULL)
	return (NULL);
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    if (IS_SCHEMA(child, "all")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_ALL, 0);
	child = child->next;
    } else if (IS_SCHEMA(child, "choice")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_CHOICE, 0);
	child = child->next;
    } else if (IS_SCHEMA(child, "sequence")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SEQUENCE, 0);
	child = child->next;
    }



    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, (all | choice | sequence)?)");
    }
    return (item);
}